

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_equal.c
# Opt level: O1

_Bool run_container_equals_array(run_container_t *container1,array_container_t *container2)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  iVar3 = run_container_cardinality(container1);
  if (iVar3 == container2->cardinality) {
    uVar4 = (ulong)container1->n_runs;
    bVar2 = (long)uVar4 < 1;
    if (0 < (long)uVar4) {
      uVar5 = 0;
      iVar3 = 0;
      do {
        uVar1 = container1->runs[uVar5].value;
        if ((container2->array[iVar3] == uVar1) &&
           (uVar6 = (uint)container1->runs[uVar5].length,
           uVar1 + uVar6 == (uint)container2->array[iVar3 + uVar6])) {
          iVar3 = iVar3 + uVar6 + 1;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        if (!bVar2) goto LAB_0011bc12;
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
      bVar2 = uVar4 <= uVar5;
    }
  }
  else {
LAB_0011bc12:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool run_container_equals_array(const run_container_t* container1,
                                const array_container_t* container2) {
    if (run_container_cardinality(container1) != container2->cardinality)
        return false;
    int32_t pos = 0;
    for (int i = 0; i < container1->n_runs; ++i) {
        const uint32_t run_start = container1->runs[i].value;
        const uint32_t le = container1->runs[i].length;

        if (container2->array[pos] != run_start) {
            return false;
        }

        if (container2->array[pos + le] != run_start + le) {
            return false;
        }

        pos += le + 1;
    }
    return true;
}